

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O3

void av1_search_palette_mode_luma
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,uint ref_frame_cost,
               PICK_MODE_CONTEXT *ctx,RD_STATS *this_rd_cost,int64_t best_rd)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  MB_MODE_INFO *pMVar5;
  PALETTE_BUFFER *best_palette_color_map;
  uint8_t *__dest;
  MB_MODE_INFO *pMVar6;
  int (*paiVar7) [2];
  uint uVar8;
  undefined7 in_register_00000011;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  int64_t best_rd_palette;
  int local_910 [2];
  int64_t local_908 [3];
  uint8_t local_8f0 [8];
  MB_MODE_INFO best_mbmi_palette;
  uint8_t best_tx_type_map [1024];
  uint8_t best_blk_skip [1024];
  
  pMVar5 = *(x->e_mbd).mi;
  best_rd_palette = best_rd;
  best_palette_color_map = x->palette_buffer;
  __dest = (x->e_mbd).plane[0].color_index_map;
  memcpy(&best_mbmi_palette,pMVar5,0xb0);
  uVar11 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  bVar1 = ""[uVar11];
  bVar2 = block_size_high[uVar11];
  bVar3 = block_size_wide[uVar11];
  pMVar5->mode = '\0';
  pMVar5->uv_mode = '\0';
  pMVar5->ref_frame[0] = '\0';
  pMVar5->ref_frame[1] = -1;
  (pMVar5->palette_mode_info).palette_size[0] = '\0';
  (pMVar5->palette_mode_info).palette_size[1] = '\0';
  local_910[0] = 0x7fffffff;
  local_910[1] = 0;
  local_908[0] = 0x7fffffffffffffff;
  local_908[1] = 0x7fffffffffffffff;
  local_908[2] = 0x7fffffffffffffff;
  local_8f0[0] = '\0';
  av1_rd_pick_palette_intra_sby
            (cpi,x,bsize,(x->mode_costs).mbmode_cost[bVar1][0],&best_mbmi_palette,
             best_palette_color_map->best_palette_color_map,&best_rd_palette,local_910,(int *)0x0,
             local_908,local_8f0,(int *)0x0,ctx,best_blk_skip,best_tx_type_map);
  if ((local_910[0] == 0x7fffffff) || ((pMVar5->palette_mode_info).palette_size[0] == '\0')) {
    this_rd_cost->rdcost = 0x7fffffffffffffff;
  }
  else {
    memcpy((x->txfm_search_info).blk_skip,best_blk_skip,
           (long)(1 << ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[uVar11] - 4 &
                       0x1f)));
    memcpy((x->e_mbd).tx_type_map,best_tx_type_map,(long)ctx->num_4x4_blk);
    memcpy(__dest,best_palette_color_map,(ulong)bVar3 * (ulong)bVar2);
    pMVar5 = (x->e_mbd).left_mbmi;
    pMVar6 = (x->e_mbd).above_mbmi;
    if (local_8f0[0] == '\0') {
      if (pMVar6 == (MB_MODE_INFO *)0x0) {
        uVar9 = 0;
      }
      else {
        uVar9 = (uint)pMVar6->skip_txfm;
      }
      if (pMVar5 == (MB_MODE_INFO *)0x0) {
        uVar8 = 0;
      }
      else {
        uVar8 = (uint)pMVar5->skip_txfm;
      }
      ref_frame_cost = ref_frame_cost + local_910[0];
      paiVar7 = (x->mode_costs).skip_txfm_cost + (uVar8 + uVar9);
    }
    else {
      if (pMVar6 == (MB_MODE_INFO *)0x0) {
        uVar9 = 0;
      }
      else {
        uVar9 = (uint)pMVar6->skip_txfm;
      }
      if (pMVar5 == (MB_MODE_INFO *)0x0) {
        uVar8 = 0;
      }
      else {
        uVar8 = (uint)pMVar5->skip_txfm;
      }
      paiVar7 = (int (*) [2])((x->mode_costs).skip_txfm_cost[uVar8 + uVar9] + 1);
    }
    iVar10 = ref_frame_cost + (*paiVar7)[0];
    iVar4 = x->rdmult;
    this_rd_cost->rate = iVar10;
    this_rd_cost->dist = local_908[0];
    this_rd_cost->rdcost = local_908[0] * 0x80 + ((long)iVar4 * (long)iVar10 + 0x100 >> 9);
    this_rd_cost->skip_txfm = local_8f0[0];
  }
  return;
}

Assistant:

void av1_search_palette_mode_luma(const AV1_COMP *cpi, MACROBLOCK *x,
                                  BLOCK_SIZE bsize, unsigned int ref_frame_cost,
                                  PICK_MODE_CONTEXT *ctx,
                                  RD_STATS *this_rd_cost, int64_t best_rd) {
  MB_MODE_INFO *const mbmi = x->e_mbd.mi[0];
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  MACROBLOCKD *const xd = &x->e_mbd;
  int64_t best_rd_palette = best_rd, this_rd;
  uint8_t *const best_palette_color_map =
      x->palette_buffer->best_palette_color_map;
  uint8_t *const color_map = xd->plane[0].color_index_map;
  MB_MODE_INFO best_mbmi_palette = *mbmi;
  uint8_t best_blk_skip[MAX_MIB_SIZE * MAX_MIB_SIZE];
  uint8_t best_tx_type_map[MAX_MIB_SIZE * MAX_MIB_SIZE];
  const ModeCosts *mode_costs = &x->mode_costs;
  const int *const intra_mode_cost =
      mode_costs->mbmode_cost[size_group_lookup[bsize]];
  const int rows = block_size_high[bsize];
  const int cols = block_size_wide[bsize];

  mbmi->mode = DC_PRED;
  mbmi->uv_mode = UV_DC_PRED;
  mbmi->ref_frame[0] = INTRA_FRAME;
  mbmi->ref_frame[1] = NONE_FRAME;
  av1_zero(pmi->palette_size);

  RD_STATS rd_stats_y;
  av1_invalid_rd_stats(&rd_stats_y);
  av1_rd_pick_palette_intra_sby(cpi, x, bsize, intra_mode_cost[DC_PRED],
                                &best_mbmi_palette, best_palette_color_map,
                                &best_rd_palette, &rd_stats_y.rate, NULL,
                                &rd_stats_y.dist, &rd_stats_y.skip_txfm, NULL,
                                ctx, best_blk_skip, best_tx_type_map);
  if (rd_stats_y.rate == INT_MAX || pmi->palette_size[0] == 0) {
    this_rd_cost->rdcost = INT64_MAX;
    return;
  }

  memcpy(x->txfm_search_info.blk_skip, best_blk_skip,
         sizeof(best_blk_skip[0]) * bsize_to_num_blk(bsize));
  av1_copy_array(xd->tx_type_map, best_tx_type_map, ctx->num_4x4_blk);
  memcpy(color_map, best_palette_color_map,
         rows * cols * sizeof(best_palette_color_map[0]));

  rd_stats_y.rate += ref_frame_cost;

  if (rd_stats_y.skip_txfm) {
    rd_stats_y.rate =
        ref_frame_cost +
        mode_costs->skip_txfm_cost[av1_get_skip_txfm_context(xd)][1];
  } else {
    rd_stats_y.rate +=
        mode_costs->skip_txfm_cost[av1_get_skip_txfm_context(xd)][0];
  }
  this_rd = RDCOST(x->rdmult, rd_stats_y.rate, rd_stats_y.dist);
  this_rd_cost->rate = rd_stats_y.rate;
  this_rd_cost->dist = rd_stats_y.dist;
  this_rd_cost->rdcost = this_rd;
  this_rd_cost->skip_txfm = rd_stats_y.skip_txfm;
}